

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O1

PHYSFS_EnumerateCallbackResult enumCallbackFilterSymLinks(void *_data,char *origdir,char *fname)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  code *pcVar3;
  undefined8 uVar4;
  int iVar5;
  PHYSFS_EnumerateCallbackResult PVar6;
  size_t sVar7;
  size_t sVar8;
  ulong *puVar9;
  ErrState *pEVar10;
  ulong *puVar11;
  char *pcVar12;
  char *__s;
  PHYSFS_ErrorCode PVar13;
  ulong __maxlen;
  bool bVar14;
  ulong local_78;
  PHYSFS_Stat statbuf;
  
  puVar11 = &local_78;
  puVar1 = *(undefined8 **)((long)_data + 0x10);
  __s = *(char **)((long)_data + 0x18) + (**(char **)((long)_data + 0x18) == '/');
  sVar7 = strlen(__s);
  statbuf._32_8_ = fname;
  sVar8 = strlen(fname);
  __maxlen = sVar7 + sVar8 + 2;
  if (__maxlen < 0x100) {
    puVar11 = (ulong *)((long)&local_78 - (sVar8 + sVar7 + 0x19 & 0xfffffffffffffff0));
    puVar9 = puVar11;
  }
  else {
    puVar9 = (ulong *)0x0;
  }
  bVar14 = puVar9 == (ulong *)0x0;
  if (bVar14) {
    puVar11[-1] = 0x1092ab;
    puVar9 = (ulong *)(*__PHYSFS_AllocatorHooks.Malloc)(sVar8 + sVar7 + 10);
  }
  if (puVar9 == (ulong *)0x0) {
    puVar9 = (ulong *)0x0;
  }
  else {
    *puVar9 = (ulong)bVar14;
    puVar9 = puVar9 + 1;
  }
  uVar4 = statbuf._32_8_;
  if (puVar9 == (ulong *)0x0) {
    *(undefined4 *)((long)_data + 0x20) = 2;
    return PHYSFS_ENUM_ERROR;
  }
  pcVar12 = "/";
  if (*__s == '\0') {
    pcVar12 = "";
  }
  PVar13 = PHYSFS_ERR_OK;
  puVar11[-1] = 0x109300;
  snprintf((char *)puVar9,__maxlen,"%s%s%s",__s,pcVar12,uVar4);
  uVar2 = *puVar1;
  pcVar3 = *(code **)(puVar1[5] + 0x68);
  puVar11[-1] = 0x109315;
  iVar5 = (*pcVar3)(uVar2,puVar9,&local_78);
  if (iVar5 == 0) {
    puVar11[-1] = 0x10935e;
    pEVar10 = findErrorForCurrentThread();
    if (pEVar10 != (ErrState *)0x0) {
      PVar13 = pEVar10->code;
    }
  }
  else {
    PVar6 = PHYSFS_ENUM_OK;
    if ((int)statbuf.accesstime == 2) goto LAB_00109375;
    uVar2 = *(undefined8 *)((long)_data + 8);
    pcVar3 = *_data;
    puVar11[-1] = 0x109336;
    PVar6 = (*pcVar3)(uVar2,origdir,uVar4);
    if (PVar6 != PHYSFS_ENUM_ERROR) goto LAB_00109375;
    PVar13 = PHYSFS_ERR_APP_CALLBACK;
  }
  *(PHYSFS_ErrorCode *)((long)_data + 0x20) = PVar13;
  PVar6 = PHYSFS_ENUM_ERROR;
LAB_00109375:
  if (puVar9[-1] != 0) {
    puVar11[-1] = 0x10938a;
    (*__PHYSFS_AllocatorHooks.Free)(puVar9 + -1);
  }
  return PVar6;
}

Assistant:

static PHYSFS_EnumerateCallbackResult enumCallbackFilterSymLinks(void *_data,
                                    const char *origdir, const char *fname)
{
    SymlinkFilterData *data = (SymlinkFilterData *) _data;
    const DirHandle *dh = data->dirhandle;
    const char *arcfname = data->arcfname;
    PHYSFS_Stat statbuf;
    const char *trimmedDir = (*arcfname == '/') ? (arcfname + 1) : arcfname;
    const size_t slen = strlen(trimmedDir) + strlen(fname) + 2;
    char *path = (char *) __PHYSFS_smallAlloc(slen);
    PHYSFS_EnumerateCallbackResult retval = PHYSFS_ENUM_OK;

    if (path == NULL)
    {
        data->errcode = PHYSFS_ERR_OUT_OF_MEMORY;
        return PHYSFS_ENUM_ERROR;
    } /* if */

    snprintf(path, slen, "%s%s%s", trimmedDir, *trimmedDir ? "/" : "", fname);

    if (!dh->funcs->stat(dh->opaque, path, &statbuf))
    {
        data->errcode = currentErrorCode();
        retval = PHYSFS_ENUM_ERROR;
    } /* if */
    else
    {
        /* Pass it on to the application if it's not a symlink. */
        if (statbuf.filetype != PHYSFS_FILETYPE_SYMLINK)
        {
            retval = data->callback(data->callbackData, origdir, fname);
            if (retval == PHYSFS_ENUM_ERROR)
                data->errcode = PHYSFS_ERR_APP_CALLBACK;
        } /* if */
    } /* else */

    __PHYSFS_smallFree(path);

    return retval;
}